

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O0

int Spl_ManComputeOne(Spl_Man_t *p,int iPivot)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_28;
  int i;
  int iObj;
  int CountAdd;
  int iPivot_local;
  Spl_Man_t *p_local;
  
  iVar1 = Gia_ObjIsLut2(p->pGia,iPivot);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsLut2(p->pGia, iPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                  ,0x1d0,"int Spl_ManComputeOne(Spl_Man_t *, int)");
  }
  for (local_28 = 0; iVar1 = Vec_IntSize(p->vNodes), local_28 < iVar1; local_28 = local_28 + 1) {
    iVar1 = Vec_IntEntry(p->vNodes,local_28);
    Vec_BitWriteEntry(p->vMarksNo,iVar1,0);
  }
  for (local_28 = 0; iVar1 = Vec_IntSize(p->vAnds), local_28 < iVar1; local_28 = local_28 + 1) {
    iVar1 = Vec_IntEntry(p->vAnds,local_28);
    Vec_BitWriteEntry(p->vMarksAnd,iVar1,0);
  }
  Vec_IntClear(p->vNodes);
  Vec_IntClear(p->vAnds);
  Spl_ManLutMffcSize(p->pGia,iPivot,p->vCands,p->vMarksAnd);
  Spl_ManAddNode(p,iPivot,p->vCands);
  iVar1 = Vec_IntSize(p->vAnds);
  if (p->Limit < iVar1) {
    p_local._4_4_ = 0;
  }
  else {
    while (iVar1 = Spl_ManFindOne(p), iVar1 != 0) {
      iVar2 = Gia_ObjIsLut2(p->pGia,iVar1);
      if (iVar2 == 0) {
        __assert_fail("Gia_ObjIsLut2(p->pGia, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                      ,0x1e8,"int Spl_ManComputeOne(Spl_Man_t *, int)");
      }
      iVar2 = Vec_BitEntry(p->vMarksNo,iVar1);
      if (iVar2 != 0) {
        __assert_fail("!Vec_BitEntry(p->vMarksNo, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                      ,0x1e9,"int Spl_ManComputeOne(Spl_Man_t *, int)");
      }
      iVar2 = Spl_ManLutMffcSize(p->pGia,iVar1,p->vCands,p->vMarksAnd);
      iVar3 = Vec_IntSize(p->vAnds);
      if (p->Limit < iVar3 + iVar2) break;
      Spl_ManAddNode(p,iVar1,p->vCands);
    }
    Vec_IntSort(p->vNodes,0);
    Vec_IntSort(p->vAnds,0);
    Spl_ManWinFindLeavesRoots(p);
    Vec_IntSort(p->vLeaves,0);
    Vec_IntSort(p->vRoots,0);
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Spl_ManComputeOne( Spl_Man_t * p, int iPivot )
{
    int CountAdd, iObj, i;
    assert( Gia_ObjIsLut2(p->pGia, iPivot) );
//Gia_ManPrintCone2( p->pGia, Gia_ManObj(p->pGia, iPivot) );
    // assume it was previously filled in
    Vec_IntForEachEntry( p->vNodes, iObj, i )
        Vec_BitWriteEntry( p->vMarksNo, iObj, 0 );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
        Vec_BitWriteEntry( p->vMarksAnd, iObj, 0 );
    // double check that it is empty
    //Gia_ManForEachLut2( p->pGia, iObj )
    //    assert( !Vec_BitEntry(p->vMarksNo, iObj) );
    //Gia_ManForEachLut2( p->pGia, iObj )
    //    assert( !Vec_BitEntry(p->vMarksAnd, iObj) );
    // clean arrays
    Vec_IntClear( p->vNodes );
    Vec_IntClear( p->vAnds );
    // add root node
    Spl_ManLutMffcSize( p->pGia, iPivot, p->vCands, p->vMarksAnd );
    Spl_ManAddNode( p, iPivot, p->vCands );
    if ( Vec_IntSize(p->vAnds) > p->Limit )
        return 0;
    //printf( "%d ", iPivot );
    // add one node at a time
    while ( (iObj = Spl_ManFindOne(p)) )
    {
        assert( Gia_ObjIsLut2(p->pGia, iObj) );
        assert( !Vec_BitEntry(p->vMarksNo, iObj) );
        CountAdd = Spl_ManLutMffcSize( p->pGia, iObj, p->vCands, p->vMarksAnd );
        if ( Vec_IntSize(p->vAnds) + CountAdd > p->Limit )
            break;
        Spl_ManAddNode( p, iObj, p->vCands );
        //printf( "+%d ", iObj );
    }
    //printf( "\n" );
    Vec_IntSort( p->vNodes, 0 );
    Vec_IntSort( p->vAnds, 0 );
    Spl_ManWinFindLeavesRoots( p );
    Vec_IntSort( p->vLeaves, 0 );
    Vec_IntSort( p->vRoots, 0 );
    return 1;
}